

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointOnCurveProjection.h
# Opt level: O0

void __thiscall
anurbs::PointOnCurveProjection<3L>::compute
          (PointOnCurveProjection<3L> *this,Vector *sample,double max_distance)

{
  PointOnCurveProjection<3L> *this_00;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
  *__return_storage_ptr__;
  type *scalar;
  type *scalar_00;
  element_type *peVar1;
  type *this_01;
  type *this_02;
  Index IVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  type_conflict *ptVar5;
  pointer this_03;
  StorageBaseType *pSVar6;
  MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *this_04;
  reference pvVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double extraout_XMM0_Qa;
  double dVar11;
  double dVar12;
  double local_480;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
  local_400;
  Vector<3> local_3e8;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [8];
  Vector point_at_t1;
  Vector<3> local_390;
  undefined1 local_378 [16];
  undefined1 local_368 [8];
  Vector point_at_t0;
  Matrix<double,1,3,1,1,3> local_338 [24];
  undefined1 local_320 [48];
  double nextParameter;
  double delta;
  bool c2;
  double dStack_2e0;
  bool c1;
  double c2v;
  double c2d;
  double c2n;
  double c1v;
  undefined1 local_2a8 [8];
  Vector dif;
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  f;
  Index i_1;
  double eps2;
  double eps1;
  Index max_iter;
  type local_220;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  local_1f8;
  size_type *local_198;
  type *idx_b;
  type *wb;
  type *idx_a;
  type *wa;
  tuple<double,_long,_double,_long> local_160;
  double local_140;
  double sq_distance;
  undefined1 local_120 [8];
  Vector v;
  type *point;
  type *t;
  undefined1 local_d8 [8];
  value_type point1;
  value_type t1;
  value_type point0;
  value_type t0;
  Index i;
  type *points;
  type *ts;
  double local_78;
  double closest_sq_distance;
  Vector closest_point;
  double closest_parameter;
  undefined1 local_40 [24];
  Interval domain;
  double max_distance_local;
  Vector *sample_local;
  PointOnCurveProjection<3L> *this_local;
  
  domain.m_t1 = max_distance;
  Curve((PointOnCurveProjection<3L> *)local_40);
  peVar1 = std::__shared_ptr_access<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
  (*peVar1->_vptr_CurveBase[3])();
  std::shared_ptr<anurbs::CurveBase<3L>_>::~shared_ptr
            ((shared_ptr<anurbs::CurveBase<3L>_> *)local_40);
  closest_point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
  [2] = 0.0;
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
            ((Matrix<double,_1,_3,_1,_1,_3> *)&closest_sq_distance);
  local_78 = INFINITY;
  this_01 = std::
            get<0ul,std::vector<double,std::allocator<double>>,std::vector<Eigen::Matrix<double,1,3,1,1,3>,std::allocator<Eigen::Matrix<double,1,3,1,1,3>>>>
                      (&this->m_tessellation);
  this_02 = std::
            get<1ul,std::vector<double,std::allocator<double>>,std::vector<Eigen::Matrix<double,1,3,1,1,3>,std::allocator<Eigen::Matrix<double,1,3,1,1,3>>>>
                      (&this->m_tessellation);
  if (0.0 < domain.m_t1) {
    this_03 = std::
              unique_ptr<anurbs::PolylineMapper<3L>,_std::default_delete<anurbs::PolylineMapper<3L>_>_>
              ::operator->(&this->mapper);
    Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix((Matrix<double,_1,_3,_1,_1,_3> *)&wa,sample);
    PolylineMapper<3L>::map(&local_160,this_03,(Vector *)&wa,domain.m_t1);
    idx_a = (type *)std::get<0ul,double,long,double,long>(&local_160);
    wb = (type *)std::get<1ul,double,long,double,long>(&local_160);
    idx_b = (type *)std::get<2ul,double,long,double,long>(&local_160);
    local_198 = (size_type *)std::get<3ul,double,long,double,long>(&local_160);
    dVar8 = (double)*idx_a;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(size_type)*wb);
    dVar9 = *pvVar3;
    dVar10 = (double)*idx_b;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this_01,*local_198);
    scalar_00 = idx_a;
    closest_point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
    array[2] = dVar8 * dVar9 + dVar10 * *pvVar3;
    pSVar6 = (StorageBaseType *)
             std::
             vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
             ::operator[](this_02,(size_type)*wb);
    Eigen::operator*(&local_220,(double *)scalar_00,pSVar6);
    scalar = idx_b;
    pSVar6 = (StorageBaseType *)
             std::
             vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
             ::operator[](this_02,*local_198);
    Eigen::operator*((type *)&max_iter,(double *)scalar,pSVar6);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Matrix<double,1,3,1,1,3>const>>
    ::operator+(&local_1f8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Matrix<double,1,3,1,1,3>const>>
                 *)&local_220,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                 *)&max_iter);
    Eigen::Matrix<double,1,3,1,1,3>::operator=
              ((Matrix<double,1,3,1,1,3> *)&closest_sq_distance,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                *)&local_1f8);
  }
  else {
    for (t0 = 4.94065645841247e-324;
        IVar2 = length<std::vector<double,std::allocator<double>>>(this_01), (long)t0 < IVar2;
        t0 = (value_type)((long)t0 + 1)) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)t0 - 1);
      point0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2]
           = *pvVar3;
      pvVar4 = std::
               vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
               ::operator[](this_02,(long)t0 - 1);
      Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix((Matrix<double,_1,_3,_1,_1,_3> *)&t1,pvVar4);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(size_type)t0);
      point1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2]
           = *pvVar3;
      pvVar4 = std::
               vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
               ::operator[](this_02,(size_type)t0);
      Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix((Matrix<double,_1,_3,_1,_1,_3> *)local_d8,pvVar4)
      ;
      project_to_line((ParameterPoint *)&t,sample,(Vector *)&t1,(Vector *)local_d8,
                      point0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                      m_data.array + 2,
                      point1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                      m_data.array + 2);
      ptVar5 = std::get<0ul,double,Eigen::Matrix<double,1,3,1,1,3>>
                         ((pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&t);
      v.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2] =
           (double)std::get<1ul,double,Eigen::Matrix<double,1,3,1,1,3>>
                             ((pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&t);
      Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
                  *)&sq_distance,
                 (MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)
                 v.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                 array[2],(MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)sample);
      Eigen::Matrix<double,1,3,1,1,3>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
                ((Matrix<double,1,3,1,1,3> *)local_120,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)&sq_distance);
      dVar8 = squared_norm((Vector<3> *)local_120);
      local_140 = dVar8;
      if (dVar8 < local_78) {
        closest_point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
        array[2] = *ptVar5;
        Eigen::Matrix<double,_1,_3,_1,_1,_3>::operator=
                  ((Matrix<double,_1,_3,_1,_1,_3> *)&closest_sq_distance,
                   (Matrix<double,_1,_3,_1,_1,_3> *)
                   v.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                   array[2]);
        local_78 = dVar8;
      }
    }
  }
  dVar8 = tolerance(this);
  dVar9 = tolerance(this);
  for (f.
       super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (long)f.
            super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage < 5;
      f.
      super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)((f.
                             super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                           super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                           m_data.array + 1)) {
    this_00 = (PointOnCurveProjection<3L> *)
              (dif.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
               array + 2);
    Curve(this_00);
    peVar1 = std::
             __shared_ptr_access<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_00);
    (*peVar1->_vptr_CurveBase[6])
              (closest_point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
               m_data.array[2],&stack0xfffffffffffffd80,peVar1,2);
    std::shared_ptr<anurbs::CurveBase<3L>_>::~shared_ptr
              ((shared_ptr<anurbs::CurveBase<3L>_> *)
               (dif.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                array + 2));
    this_04 = (MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)
              std::
              vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                            *)&stack0xfffffffffffffd80,0);
    Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
                *)&c1v,this_04,(MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)sample);
    Eigen::Matrix<double,1,3,1,1,3>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
              ((Matrix<double,1,3,1,1,3> *)local_2a8,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)&c1v);
    c2n = norm((Vector<3> *)local_2a8);
    pvVar7 = std::
             vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                           *)&stack0xfffffffffffffd80,1);
    c2d = dot(pvVar7,(Vector<3> *)local_2a8);
    pvVar7 = std::
             vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                           *)&stack0xfffffffffffffd80,1);
    dVar10 = norm(pvVar7);
    c2v = dVar10 * c2n;
    if ((c2v != 0.0) || (NAN(c2v))) {
      local_480 = c2d / c2v;
    }
    else {
      local_480 = 0.0;
    }
    dStack_2e0 = local_480;
    delta._7_1_ = c2n < dVar8;
    std::abs((int)pvVar7);
    delta._6_1_ = extraout_XMM0_Qa < dVar9 * 5.0;
    if (((delta._7_1_ & 1) != 0) || ((bool)delta._6_1_)) {
      delta._0_4_ = 5;
    }
    else {
      pvVar7 = std::
               vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
               ::operator[]((vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                             *)&stack0xfffffffffffffd80,1);
      dVar10 = dot(pvVar7,(Vector<3> *)local_2a8);
      pvVar7 = std::
               vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
               ::operator[]((vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                             *)&stack0xfffffffffffffd80,2);
      dVar11 = dot(pvVar7,(Vector<3> *)local_2a8);
      pvVar7 = std::
               vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
               ::operator[]((vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                             *)&stack0xfffffffffffffd80,1);
      dVar12 = squared_norm(pvVar7);
      nextParameter = dVar10 / (dVar11 + dVar12);
      local_320._40_8_ =
           closest_point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data.array[2] - nextParameter;
      closest_point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
      array[2] = Interval::clamp((Interval *)(local_40 + 0x10),(double)local_320._40_8_);
      delta._0_4_ = 0;
    }
    std::
    vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
    ::~vector((vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
               *)&stack0xfffffffffffffd80);
    if (delta._0_4_ != 0) break;
  }
  Curve((PointOnCurveProjection<3L> *)local_320);
  peVar1 = std::__shared_ptr_access<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_320);
  (*peVar1->_vptr_CurveBase[5])
            (closest_point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[2],local_320 + 0x10);
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::operator=
            ((Matrix<double,_1,_3,_1,_1,_3> *)&closest_sq_distance,
             (Matrix<double,_1,_3,_1,_1,_3> *)(local_320 + 0x10));
  std::shared_ptr<anurbs::CurveBase<3L>_>::~shared_ptr
            ((shared_ptr<anurbs::CurveBase<3L>_> *)local_320);
  __return_storage_ptr__ =
       (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
        *)(point_at_t0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
           .array + 2);
  Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::operator-
            (__return_storage_ptr__,(MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)sample,
             (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&closest_sq_distance);
  Eigen::Matrix<double,1,3,1,1,3>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
            (local_338,__return_storage_ptr__);
  dVar8 = squared_norm((Vector<3> *)local_338);
  Curve((PointOnCurveProjection<3L> *)local_378);
  peVar1 = std::__shared_ptr_access<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_378);
  Interval::t0((Interval *)(local_40 + 0x10));
  (*peVar1->_vptr_CurveBase[5])(local_368);
  std::shared_ptr<anurbs::CurveBase<3L>_>::~shared_ptr
            ((shared_ptr<anurbs::CurveBase<3L>_> *)local_378);
  Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
              *)(point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                 m_data.array + 2),(MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)sample,
             (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)local_368);
  Eigen::Matrix<double,1,3,1,1,3>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
            ((Matrix<double,1,3,1,1,3> *)&local_390,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
              *)(point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                 m_data.array + 2));
  dVar9 = squared_norm(&local_390);
  if (dVar8 <= dVar9) {
    Curve((PointOnCurveProjection<3L> *)local_3d0);
    peVar1 = std::
             __shared_ptr_access<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_3d0);
    Interval::t1((Interval *)(local_40 + 0x10));
    (*peVar1->_vptr_CurveBase[5])(local_3c0);
    std::shared_ptr<anurbs::CurveBase<3L>_>::~shared_ptr
              ((shared_ptr<anurbs::CurveBase<3L>_> *)local_3d0);
    Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::operator-
              (&local_400,(MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)sample,
               (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)local_3c0);
    Eigen::Matrix<double,1,3,1,1,3>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
              ((Matrix<double,1,3,1,1,3> *)&local_3e8,&local_400);
    dVar9 = squared_norm(&local_3e8);
    if (dVar8 <= dVar9) {
      this->m_parameter =
           closest_point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data.array[2];
      Eigen::Matrix<double,_1,_3,_1,_1,_3>::operator=
                (&this->m_point,(Matrix<double,_1,_3,_1,_1,_3> *)&closest_sq_distance);
    }
    else {
      dVar8 = Interval::t1((Interval *)(local_40 + 0x10));
      this->m_parameter = dVar8;
      Eigen::Matrix<double,_1,_3,_1,_1,_3>::operator=
                (&this->m_point,(Matrix<double,_1,_3,_1,_1,_3> *)local_3c0);
    }
  }
  else {
    dVar8 = Interval::t0((Interval *)(local_40 + 0x10));
    this->m_parameter = dVar8;
    Eigen::Matrix<double,_1,_3,_1,_1,_3>::operator=
              (&this->m_point,(Matrix<double,_1,_3,_1,_1,_3> *)local_368);
  }
  return;
}

Assistant:

void compute(const Vector& sample, const double max_distance = 0)
    {
        const auto domain = Curve()->domain();

        // closest point to polyline

        double closest_parameter = 0;
        Vector closest_point;

        double closest_sq_distance = Infinity;

        const auto& [ts, points] = m_tessellation;

        if (max_distance <= 0) {
            for (Index i = 1; i < length(ts); i++) {
                const auto t0 = ts[i - 1];
                const auto point0 = points[i - 1];
                const auto t1 = ts[i];
                const auto point1 = points[i];

                const auto [t, point] = project_to_line(sample, point0, point1, t0, t1);

                const Vector v = point - sample;

                const double sq_distance = squared_norm(v);

                if (sq_distance < closest_sq_distance) {
                    closest_sq_distance = sq_distance;
                    closest_parameter = t;
                    closest_point = point;
                }
            }
        } else {
            const auto [wa, idx_a, wb, idx_b] = mapper->map(sample, max_distance);

            closest_parameter = wa * ts[idx_a] + wb * ts[idx_b];
            closest_point = wa * points[idx_a] + wb * points[idx_b];
        }

        // newton-raphson

        const Index max_iter = 5;
        const double eps1 = tolerance();
        const double eps2 = tolerance() * 5;

        for (Index i = 0; i < max_iter; i++) {
            auto f = Curve()->derivatives_at(closest_parameter, 2);

            Vector dif = f[0] - sample;

            double c1v = norm(dif);

            double c2n = dot(f[1], dif);
            double c2d = norm(f[1]) * c1v;
            double c2v = c2d != 0 ? c2n / c2d : 0;

            bool c1 = c1v < eps1;
            bool c2 = std::abs(c2v) < eps2;

            if (c1 || c2) { // FIXME: check if 'or' is correct (NURBS Book P.231)
                break;
            }

            double delta = dot(f[1], dif) / (dot(f[2], dif) + squared_norm(f[1]));

            double nextParameter = closest_parameter - delta;

            // FIXME: out-of-domain check

            // FIXME: 3. condition: (nextParameter - closest_parameter) * f[1].norm();

            closest_parameter = domain.clamp(nextParameter);
        }

        closest_point = Curve()->point_at(closest_parameter);

        closest_sq_distance = squared_norm(Vector(sample - closest_point));

        Vector point_at_t0 = Curve()->point_at(domain.t0());

        if (squared_norm(Vector(sample - point_at_t0)) < closest_sq_distance) {
            m_parameter = domain.t0();
            m_point = point_at_t0;
            return;
        }

        Vector point_at_t1 = Curve()->point_at(domain.t1());

        if (squared_norm(Vector(sample - point_at_t1)) < closest_sq_distance) {
            m_parameter = domain.t1();
            m_point = point_at_t1;
            return;
        }

        m_parameter = closest_parameter;
        m_point = closest_point;
    }